

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O2

bool duckdb::IsFileCompressed(string *path,FileCompressionType type)

{
  bool bVar1;
  FileCompressionType in_DL;
  undefined7 in_register_00000031;
  string sStack_98;
  string local_78;
  string extension;
  allocator local_38 [32];
  
  CompressionExtensionFromType_abi_cxx11_
            (&extension,(duckdb *)CONCAT71(in_register_00000031,type),in_DL);
  ::std::__cxx11::string::string((string *)&local_78,(string *)path);
  ::std::__cxx11::string::string((string *)&sStack_98,"\\\\?\\",local_38);
  bVar1 = StringUtil::StartsWith(&local_78,&sStack_98);
  ::std::__cxx11::string::~string((string *)&sStack_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  if (!bVar1) {
    ::std::__cxx11::string::find((char)path,0x3f);
  }
  ::std::__cxx11::string::substr((ulong)local_38,(ulong)path);
  ::std::__cxx11::string::operator=((string *)path,(string *)local_38);
  ::std::__cxx11::string::~string((string *)local_38);
  bVar1 = StringUtil::EndsWith(path,&extension);
  ::std::__cxx11::string::~string((string *)&extension);
  return bVar1;
}

Assistant:

bool IsFileCompressed(string path, FileCompressionType type) {
	auto extension = CompressionExtensionFromType(type);
	std::size_t question_mark_pos = std::string::npos;
	if (!StringUtil::StartsWith(path, "\\\\?\\")) {
		question_mark_pos = path.find('?');
	}
	path = path.substr(0, question_mark_pos);
	if (StringUtil::EndsWith(path, extension)) {
		return true;
	}
	return false;
}